

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
unitStrings_crazyunits_Test::~unitStrings_crazyunits_Test(unitStrings_crazyunits_Test *this)

{
  unitStrings_crazyunits_Test *this_local;
  
  ~unitStrings_crazyunits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitStrings, crazyunits)
{
    unit cz{detail::unit_data(1, 2, 3, 1, -1, -1, 0, 0, 0, 0, 0, 0, 0, 0)};
    auto str = to_string(cz);
    EXPECT_EQ(str, "m*kg^2*s^3*A*K^-1*mol^-1");
    // thermal conductivity W/(m*K)
    unit tc{detail::unit_data(1, 1, -3, 0, -1, 0, 0, 0, 0, 0, 0, 0, 0, 0)};
    str = to_string(tc);
    EXPECT_EQ(str, "W*m^-1*K^-1");
    EXPECT_EQ(to_string(precise_unit(10, precise::pu)), "10*pu");
}